

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::NodeTranslator::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,NodeTranslator *this,
          Reader filename)

{
  Resolver *pRVar1;
  ErrorReporter *this_00;
  NullableValue<kj::Array<const_unsigned_char>_> *other;
  Array<const_unsigned_char> *pAVar2;
  ArrayPtr<const_char> local_c0;
  String local_b0;
  ArrayPtr<const_char> local_98;
  undefined4 local_88;
  ArrayPtr<const_char> local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Maybe<kj::Array<const_unsigned_char>_> local_58;
  undefined1 local_38 [8];
  NullableValue<kj::Array<const_unsigned_char>_> data;
  NodeTranslator *this_local;
  
  pRVar1 = this->resolver;
  data.field_1.value.disposer = (ArrayDisposer *)this;
  local_78 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&filename);
  local_68 = local_78.ptr._0_4_;
  uStack_64 = local_78.ptr._4_4_;
  uStack_60 = (undefined4)local_78.size_;
  uStack_5c = local_78.size_._4_4_;
  (*pRVar1->_vptr_Resolver[9])(&local_58,pRVar1,local_78.ptr,local_78.size_);
  other = kj::_::readMaybe<kj::Array<unsigned_char_const>>(&local_58);
  kj::_::NullableValue<kj::Array<const_unsigned_char>_>::NullableValue
            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_38,other);
  kj::Maybe<kj::Array<const_unsigned_char>_>::~Maybe(&local_58);
  pAVar2 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_38);
  if (pAVar2 == (Array<const_unsigned_char> *)0x0) {
    this_00 = this->errorReporter;
    local_c0 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&filename);
    kj::str<char_const(&)[31],capnp::Text::Reader>
              (&local_b0,(kj *)"Couldn\'t read file for embed: ",(char (*) [31])&local_c0,
               (Reader *)local_c0.ptr);
    kj::StringPtr::StringPtr((StringPtr *)&local_98,&local_b0);
    ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
              (this_00,&filename,(StringPtr)local_98);
    kj::String::~String(&local_b0);
    kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    pAVar2 = kj::_::NullableValue<kj::Array<const_unsigned_char>_>::operator*
                       ((NullableValue<kj::Array<const_unsigned_char>_> *)local_38);
    pAVar2 = kj::mv<kj::Array<unsigned_char_const>>(pAVar2);
    kj::Maybe<kj::Array<const_unsigned_char>_>::Maybe(__return_storage_ptr__,pAVar2);
  }
  local_88 = 1;
  kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue
            ((NullableValue<kj::Array<const_unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> NodeTranslator::readEmbed(LocatedText::Reader filename) {
  KJ_IF_MAYBE(data, resolver.readEmbed(filename.getValue())) {
    return kj::mv(*data);
  } else {
    errorReporter.addErrorOn(filename,
        kj::str("Couldn't read file for embed: ", filename.getValue()));
    return nullptr;
  }